

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void __thiscall
llvm::write_hex(llvm *this,raw_ostream *S,uint64_t N,HexPrintStyle Style,
               Optional<unsigned_long> Width)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long uVar5;
  undefined4 in_register_0000000c;
  unsigned_long uVar6;
  char *__n;
  char cVar7;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_b8;
  Optional<unsigned_long> Width_local;
  char NumberBuffer [128];
  
  local_b8.value._4_4_ = in_register_0000000c;
  local_b8.value._0_4_ = Style;
  Width_local.Storage.field_0.empty = Width.Storage.field_0._0_1_;
  Width_local.Storage._8_8_ = Width_local.Storage._8_8_ & 0xffffffff00000000;
  uVar5 = Optional<unsigned_long>::getValueOr<unsigned_int>
                    ((Optional<unsigned_long> *)&local_b8,(uint *)&Width_local.Storage.hasVal);
  uVar6 = 0x80;
  if (uVar5 < 0x80) {
    uVar6 = uVar5;
  }
  if (S == (raw_ostream *)0x0) {
    uVar3 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (S != (raw_ostream *)0x0) {
      for (; (ulong)S >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = (uint)lVar1 ^ 0x3f;
  }
  uVar3 = 0x43 - uVar3 >> 2;
  uVar4 = (uint)N & 0xfffffffe;
  uVar3 = (uint)(uVar4 == 2) * 2 + uVar3 + (uint)(uVar3 == 0);
  if (uVar3 <= (uint)uVar6) {
    uVar3 = (uint)uVar6;
  }
  Width_local.Storage.hasVal = true;
  Width_local.Storage._9_7_ = 0x30303030303030;
  if (uVar4 == 2) {
    Width_local.Storage.hasVal = true;
    Width_local.Storage._9_7_ = 0x30303030303078;
  }
  __n = (undefined1 *)((long)&Width_local.Storage.field_0 + 7) + (long)(ulong)uVar3;
  for (; S != (raw_ostream *)0x0; S = (raw_ostream *)((ulong)S >> 4)) {
    uVar4 = (uint)S & 0xf;
    cVar2 = (char)uVar4;
    cVar7 = cVar2 + '0';
    if (9 < uVar4) {
      cVar7 = ((N & 0xfffffffd) != 0) * ' ' + '7' + cVar2;
    }
    *__n = cVar7;
    __n = __n + -1;
  }
  raw_ostream::write((raw_ostream *)this,(int)&Width_local + 8,(void *)(ulong)uVar3,(size_t)__n);
  return;
}

Assistant:

void llvm::write_hex(raw_ostream &S, uint64_t N, HexPrintStyle Style,
                     Optional<size_t> Width) {
  const size_t kMaxWidth = 128u;

  size_t W = std::min(kMaxWidth, Width.getValueOr(0u));

  unsigned Nibbles = (64 - countLeadingZeros(N) + 3) / 4;
  bool Prefix = (Style == HexPrintStyle::PrefixLower ||
                 Style == HexPrintStyle::PrefixUpper);
  bool Upper =
      (Style == HexPrintStyle::Upper || Style == HexPrintStyle::PrefixUpper);
  unsigned PrefixChars = Prefix ? 2 : 0;
  unsigned NumChars =
      std::max(static_cast<unsigned>(W), std::max(1u, Nibbles) + PrefixChars);

  char NumberBuffer[kMaxWidth];
  ::memset(NumberBuffer, '0', llvm::array_lengthof(NumberBuffer));
  if (Prefix)
    NumberBuffer[1] = 'x';
  char *EndPtr = NumberBuffer + NumChars;
  char *CurPtr = EndPtr;
  while (N) {
    unsigned char x = static_cast<unsigned char>(N) % 16;
    *--CurPtr = hexdigit(x, !Upper);
    N /= 16;
  }

  S.write(NumberBuffer, NumChars);
}